

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmemory.c
# Opt level: O2

void debugmem_tag_error(void *p)

{
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlGenericErrorFunc *pp_Var1;
  void **ppvVar2;
  
  pp_Var1 = __xmlGenericError();
  UNRECOVERED_JUMPTABLE = *pp_Var1;
  ppvVar2 = __xmlGenericErrorContext();
  (*UNRECOVERED_JUMPTABLE)
            (*ppvVar2,"Memory tag error occurs :%p \n\t bye\n",p,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

static void debugmem_tag_error(void *p)
{
     xmlGenericError(xmlGenericErrorContext,
	     "Memory tag error occurs :%p \n\t bye\n", p);
#ifdef MEM_LIST
     if (stderr)
     xmlMemDisplay(stderr);
#endif
}